

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_sps.c
# Opt level: O3

MPP_RET process_subsps(H264_SLICE_t *currSlice)

{
  size_t size;
  size_t size_00;
  bitread_ctx_t *p_bitctx;
  int iVar1;
  uint uVar2;
  h264d_cur_ctx_t *phVar3;
  MPP_RET MVar4;
  h264_subsps_t *cur_sps;
  h264_subsps_t *phVar5;
  RK_S32 *pRVar6;
  RK_S32 **ppRVar7;
  char *fmt;
  long lVar8;
  undefined8 uVar9;
  ulong uVar10;
  RK_S32 _out;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  phVar3 = currSlice->p_Cur;
  p_bitctx = &phVar3->bitctx;
  cur_sps = phVar3->subsps;
  if (cur_sps == (h264_subsps_t *)0x0) {
    cur_sps = (h264_subsps_t *)mpp_osal_calloc("process_subsps",0x10c0);
    currSlice->p_Cur->subsps = cur_sps;
  }
  memset(cur_sps,0,0x10c0);
  cur_sps->num_views_minus1 = -1;
  cur_sps->num_level_values_signalled_minus1 = -1;
  MVar4 = parser_sps(p_bitctx,&cur_sps->sps,currSlice->p_Dec);
  if (MVar4 < MPP_OK) {
    if (((byte)h264d_debug & 4) == 0) goto LAB_00190492;
    uVar9 = 0x224;
  }
  else {
    iVar1 = (cur_sps->sps).profile_idc;
    if ((iVar1 != 0x80) && (iVar1 != 0x76)) goto LAB_0018fd33;
    MVar4 = mpp_read_bits(p_bitctx,1,(RK_S32 *)&local_44);
    (phVar3->bitctx).ret = MVar4;
    if (MVar4 == MPP_OK) {
      cur_sps->bit_equal_to_one = local_44;
      if ((local_44 != 1 && ((byte)h264d_debug & 2) != 0) &&
         (_mpp_log_l(2,"h264d_sps","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "cur_subsps->bit_equal_to_one == 1","parser_subsps_ext",0x179),
         (mpp_debug._3_1_ & 0x10) != 0)) {
        abort();
      }
      MVar4 = mpp_read_ue(p_bitctx,&local_44);
      (phVar3->bitctx).ret = MVar4;
      if (MVar4 == MPP_OK) {
        uVar10 = (ulong)local_44;
        cur_sps->num_views_minus1 = local_44;
        if ((int)local_44 < 0x10) {
          if ((int)local_44 < 0) {
LAB_0018fe8c:
            MVar4 = mpp_read_bits(p_bitctx,1,(RK_S32 *)&local_44);
            (phVar3->bitctx).ret = MVar4;
            if (MVar4 == MPP_OK) {
              cur_sps->mvc_vui_parameters_present_flag = local_44;
              goto LAB_0018fd33;
            }
            goto LAB_0018fd29;
          }
          size = uVar10 * 4 + 4;
          pRVar6 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",size);
          cur_sps->view_id = pRVar6;
          pRVar6 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",size);
          cur_sps->num_anchor_refs_l0 = pRVar6;
          pRVar6 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",size);
          cur_sps->num_anchor_refs_l1 = pRVar6;
          size_00 = uVar10 * 8 + 8;
          local_40 = uVar10;
          ppRVar7 = (RK_S32 **)mpp_osal_calloc("sps_mvc_extension",size_00);
          cur_sps->anchor_ref_l0 = ppRVar7;
          ppRVar7 = (RK_S32 **)mpp_osal_calloc("sps_mvc_extension",size_00);
          cur_sps->anchor_ref_l1 = ppRVar7;
          pRVar6 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",size);
          cur_sps->num_non_anchor_refs_l0 = pRVar6;
          pRVar6 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",size);
          cur_sps->num_non_anchor_refs_l1 = pRVar6;
          ppRVar7 = (RK_S32 **)mpp_osal_calloc("sps_mvc_extension",size_00);
          cur_sps->non_anchor_ref_l0 = ppRVar7;
          ppRVar7 = (RK_S32 **)mpp_osal_calloc("sps_mvc_extension",size_00);
          cur_sps->non_anchor_ref_l1 = ppRVar7;
          if ((((((cur_sps->view_id == (RK_S32 *)0x0) ||
                 (cur_sps->num_anchor_refs_l0 == (RK_S32 *)0x0)) ||
                (cur_sps->num_anchor_refs_l1 == (RK_S32 *)0x0)) ||
               ((cur_sps->anchor_ref_l0 == (RK_S32 **)0x0 ||
                (cur_sps->anchor_ref_l1 == (RK_S32 **)0x0)))) ||
              ((cur_sps->num_non_anchor_refs_l0 == (RK_S32 *)0x0 ||
               ((cur_sps->num_non_anchor_refs_l1 == (RK_S32 *)0x0 ||
                (cur_sps->non_anchor_ref_l0 == (RK_S32 **)0x0)))))) || (ppRVar7 == (RK_S32 **)0x0))
          {
            MVar4 = MPP_ERR_MALLOC;
            if (((byte)h264d_debug & 1) != 0) {
              fmt = "malloc buffer error(%d).\n";
              uVar9 = 0x141;
              MVar4 = MPP_ERR_MALLOC;
              goto LAB_00190434;
            }
          }
          else {
            local_38 = local_40 + 1;
            uVar10 = 0;
            do {
              MVar4 = mpp_read_ue(p_bitctx,&local_44);
              (phVar3->bitctx).ret = MVar4;
              if (MVar4 != MPP_OK) goto LAB_0018fe84;
              cur_sps->view_id[uVar10] = local_44;
              uVar10 = uVar10 + 1;
            } while (local_38 != uVar10);
            if (local_40 == 0) goto LAB_0018fe8c;
            local_40 = 1;
            do {
              MVar4 = mpp_read_ue(p_bitctx,&local_44);
              uVar10 = local_40;
              (phVar3->bitctx).ret = MVar4;
              if (MVar4 != MPP_OK) goto LAB_0018fe84;
              pRVar6 = cur_sps->num_anchor_refs_l0;
              pRVar6[local_40] = local_44;
              lVar8 = (long)pRVar6[local_40];
              if (lVar8 != 0) {
                pRVar6 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",lVar8 << 2);
                cur_sps->anchor_ref_l0[uVar10] = pRVar6;
                if (cur_sps->anchor_ref_l0[uVar10] == (RK_S32 *)0x0) {
                  if (((byte)h264d_debug & 1) == 0) goto LAB_00190525;
                  uVar9 = 0x14a;
                  goto LAB_0019051e;
                }
                if (0 < cur_sps->num_anchor_refs_l0[uVar10]) {
                  lVar8 = 0;
                  do {
                    MVar4 = mpp_read_ue(p_bitctx,&local_44);
                    (phVar3->bitctx).ret = MVar4;
                    if (MVar4 != MPP_OK) goto LAB_0018fe84;
                    cur_sps->anchor_ref_l0[local_40][lVar8] = local_44;
                    lVar8 = lVar8 + 1;
                  } while (lVar8 < cur_sps->num_anchor_refs_l0[local_40]);
                }
              }
              MVar4 = mpp_read_ue(p_bitctx,&local_44);
              uVar10 = local_40;
              (phVar3->bitctx).ret = MVar4;
              if (MVar4 != MPP_OK) goto LAB_0018fe84;
              pRVar6 = cur_sps->num_anchor_refs_l1;
              pRVar6[local_40] = local_44;
              lVar8 = (long)pRVar6[local_40];
              if (lVar8 != 0) {
                pRVar6 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",lVar8 << 2);
                cur_sps->anchor_ref_l1[uVar10] = pRVar6;
                if (cur_sps->anchor_ref_l1[uVar10] == (RK_S32 *)0x0) {
                  if (((byte)h264d_debug & 1) == 0) goto LAB_00190525;
                  uVar9 = 0x152;
                  goto LAB_0019051e;
                }
                if (0 < cur_sps->num_anchor_refs_l1[uVar10]) {
                  lVar8 = 0;
                  do {
                    MVar4 = mpp_read_ue(p_bitctx,&local_44);
                    (phVar3->bitctx).ret = MVar4;
                    if (MVar4 != MPP_OK) goto LAB_0018fe84;
                    cur_sps->anchor_ref_l1[local_40][lVar8] = local_44;
                    lVar8 = lVar8 + 1;
                    uVar10 = local_40;
                  } while (lVar8 < cur_sps->num_anchor_refs_l1[local_40]);
                }
              }
              local_40 = uVar10 + 1;
            } while (local_40 != local_38);
            local_40 = 1;
LAB_00190228:
            MVar4 = mpp_read_ue(p_bitctx,&local_44);
            (phVar3->bitctx).ret = MVar4;
            if (MVar4 != MPP_OK) goto LAB_0018fe84;
            pRVar6 = cur_sps->num_non_anchor_refs_l0;
            pRVar6[local_40] = local_44;
            lVar8 = (long)pRVar6[local_40];
            if (lVar8 == 0) {
LAB_001902f4:
              MVar4 = mpp_read_ue(p_bitctx,&local_44);
              (phVar3->bitctx).ret = MVar4;
              if (MVar4 != MPP_OK) goto LAB_0018fe84;
              pRVar6 = cur_sps->num_non_anchor_refs_l1;
              pRVar6[local_40] = local_44;
              lVar8 = (long)pRVar6[local_40];
              if (lVar8 != 0) {
                pRVar6 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",lVar8 << 2);
                cur_sps->non_anchor_ref_l1[local_40] = pRVar6;
                if (cur_sps->non_anchor_ref_l1[local_40] == (RK_S32 *)0x0) {
                  if (((byte)h264d_debug & 1) == 0) goto LAB_00190525;
                  uVar9 = 0x164;
                  goto LAB_0019051e;
                }
                if (0 < cur_sps->num_non_anchor_refs_l1[local_40]) {
                  lVar8 = 0;
                  do {
                    MVar4 = mpp_read_ue(p_bitctx,&local_44);
                    (phVar3->bitctx).ret = MVar4;
                    if (MVar4 != MPP_OK) goto LAB_0018fe84;
                    cur_sps->non_anchor_ref_l1[local_40][lVar8] = local_44;
                    lVar8 = lVar8 + 1;
                  } while (lVar8 < cur_sps->num_non_anchor_refs_l1[local_40]);
                }
              }
              local_40 = local_40 + 1;
              if (local_40 == local_38) goto LAB_0018fe8c;
              goto LAB_00190228;
            }
            pRVar6 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",lVar8 << 2);
            cur_sps->non_anchor_ref_l0[local_40] = pRVar6;
            if (cur_sps->non_anchor_ref_l0[local_40] != (RK_S32 *)0x0) {
              if (0 < cur_sps->num_non_anchor_refs_l0[local_40]) {
                lVar8 = 0;
                do {
                  MVar4 = mpp_read_ue(p_bitctx,&local_44);
                  (phVar3->bitctx).ret = MVar4;
                  if (MVar4 != MPP_OK) goto LAB_0018fe84;
                  cur_sps->non_anchor_ref_l0[local_40][lVar8] = local_44;
                  lVar8 = lVar8 + 1;
                } while (lVar8 < cur_sps->num_non_anchor_refs_l0[local_40]);
              }
              goto LAB_001902f4;
            }
            if (((byte)h264d_debug & 1) == 0) goto LAB_00190525;
            uVar9 = 0x15c;
LAB_0019051e:
            _mpp_log_l(4,"h264d_sps","malloc buffer error(%d).\n",(char *)0x0,uVar9);
LAB_00190525:
            MVar4 = MPP_ERR_MALLOC;
          }
        }
        else {
          MVar4 = MPP_ERR_VALUE;
          if (((byte)h264d_debug & 4) != 0) {
            fmt = "value error(%d).\n";
            uVar9 = 0x130;
            MVar4 = MPP_ERR_VALUE;
LAB_00190434:
            _mpp_log_l(4,"h264d_sps",fmt,(char *)0x0,uVar9);
          }
        }
      }
      else {
LAB_0018fe84:
        if (MPP_NOK < MVar4) goto LAB_0018fe8c;
      }
      if (((byte)h264d_debug & 4) != 0) {
        _mpp_log_l(4,"h264d_sps","Function error(%d).\n",(char *)0x0,0x17a);
      }
    }
    else {
LAB_0018fd29:
      if (MPP_NOK < MVar4) {
LAB_0018fd33:
        if ((cur_sps->sps).Valid != 0) {
          cur_sps->Valid = 1;
          currSlice->p_Vid->profile_idc = (cur_sps->sps).profile_idc;
        }
        get_max_dec_frame_buf_size(&cur_sps->sps);
        phVar5 = currSlice->p_Vid->subspsSet[(cur_sps->sps).seq_parameter_set_id];
        if (phVar5 == (h264_subsps_t *)0x0) {
          phVar5 = (h264_subsps_t *)mpp_osal_calloc("process_subsps",0x10c0);
          uVar2 = (cur_sps->sps).seq_parameter_set_id;
          currSlice->p_Vid->subspsSet[uVar2] = phVar5;
          phVar5 = currSlice->p_Vid->subspsSet[uVar2];
        }
        if (phVar5->Valid != 0) {
          recycle_subsps(phVar5);
        }
        memcpy(phVar5,cur_sps,0x10c0);
        return MPP_OK;
      }
    }
    if (((byte)h264d_debug & 4) == 0) goto LAB_00190492;
    uVar9 = 0x225;
  }
  _mpp_log_l(4,"h264d_sps","Function error(%d).\n",(char *)0x0,uVar9);
LAB_00190492:
  recycle_subsps(currSlice->p_Cur->subsps);
  return MVar4;
}

Assistant:

MPP_RET process_subsps(H264_SLICE_t *currSlice)
{
    MPP_RET ret = MPP_ERR_UNKNOW;

    BitReadCtx_t *p_bitctx = &currSlice->p_Cur->bitctx;
    H264_subSPS_t *cur_subsps = NULL;
    H264_subSPS_t *p_subset = NULL;

    if (!currSlice->p_Cur->subsps)
        currSlice->p_Cur->subsps = mpp_calloc(H264_subSPS_t, 1);

    cur_subsps = currSlice->p_Cur->subsps;
    reset_cur_subpps_data(cur_subsps); //reset

    FUN_CHECK(ret = parser_sps(p_bitctx, &cur_subsps->sps, currSlice->p_Dec));
    FUN_CHECK(ret = parser_subsps_ext(p_bitctx, cur_subsps));
    if (cur_subsps->sps.Valid) {
        cur_subsps->Valid = 1;
        currSlice->p_Vid->profile_idc = cur_subsps->sps.profile_idc;
    }
    get_max_dec_frame_buf_size(&cur_subsps->sps);
    //!< make subSPS available
    if (!currSlice->p_Vid->subspsSet[cur_subsps->sps.seq_parameter_set_id])
        currSlice->p_Vid->subspsSet[cur_subsps->sps.seq_parameter_set_id] = mpp_calloc(H264_subSPS_t, 1);
    p_subset = currSlice->p_Vid->subspsSet[cur_subsps->sps.seq_parameter_set_id];
    if (p_subset->Valid) {
        recycle_subsps(p_subset);
    }
    memcpy(p_subset, cur_subsps, sizeof(H264_subSPS_t));

    return ret = MPP_OK;
__FAILED:
    recycle_subsps(currSlice->p_Cur->subsps);

    return ret;
}